

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O0

void __thiscall arangodb::velocypack::Builder::reserve(Builder *this,ValueLength len)

{
  long lVar1;
  ValueLength VVar2;
  uchar *puVar3;
  long in_RSI;
  Buffer<unsigned_char> *in_RDI;
  ValueLength in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_RDI->_local + 8);
  VVar2 = Buffer<unsigned_char>::capacity((Buffer<unsigned_char> *)in_RDI->_size);
  if (VVar2 <= (ulong)(lVar1 + in_RSI)) {
    Buffer<unsigned_char>::reserve(in_RDI,in_stack_ffffffffffffffd8);
    puVar3 = Buffer<unsigned_char>::data((Buffer<unsigned_char> *)in_RDI->_size);
    *(uchar **)in_RDI->_local = puVar3;
  }
  return;
}

Assistant:

void reserve(ValueLength len) {
    VELOCYPACK_ASSERT(_start == _bufferPtr->data());
    VELOCYPACK_ASSERT(_start + _pos >= _bufferPtr->data());
    VELOCYPACK_ASSERT(_start + _pos <= _bufferPtr->data() + _bufferPtr->size());

    // Reserves len bytes at pos of the current state (top of stack)
    // or throws an exception
    if (_pos + len < _bufferPtr->capacity()) {
      return;  // All OK, we can just increase tos->pos by len
    }

#ifndef VELOCYPACK_64BIT
    (void)checkOverflow(_pos + len);
#endif

    VELOCYPACK_ASSERT(_bufferPtr != nullptr);
    _bufferPtr->reserve(len);
    _start = _bufferPtr->data();
  }